

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O3

string * __thiscall
mocker::ir::fmtInst_abi_cxx11_
          (string *__return_storage_ptr__,ir *this,shared_ptr<mocker::ir::IRInst> *inst)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ir *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  shared_ptr<mocker::ir::Addr> *addr;
  shared_ptr<mocker::ir::Addr> *extraout_RDX;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_00;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_01;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_02;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_03;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_04;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_05;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_06;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_07;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_08;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_09;
  shared_ptr<mocker::ir::Addr> *psVar13;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_10;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_11;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_12;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_13;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_14;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_15;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_16;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_17;
  shared_ptr<mocker::ir::Addr> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  long lVar15;
  ulong uVar16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var17;
  ir *piVar18;
  long lVar19;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c0;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  undefined4 *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 local_21c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  ulong local_208;
  shared_ptr<mocker::ir::Addr> sStack_200;
  undefined4 local_1f0;
  undefined2 *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined1 uStack_1d6;
  char cStack_1d5;
  undefined2 uStack_1d4;
  char cStack_1d2;
  undefined4 uStack_1cd;
  char local_1c9;
  undefined4 local_1c8;
  undefined2 *local_1c0;
  undefined8 local_1b8;
  undefined2 local_1b0;
  undefined1 uStack_1ae;
  char cStack_1ad;
  undefined7 uStack_1ac;
  undefined4 uStack_1a5;
  char local_1a1;
  undefined4 local_1a0;
  undefined2 *local_198;
  undefined8 local_190;
  undefined2 local_188;
  undefined1 uStack_186;
  char cStack_185;
  undefined7 uStack_184;
  undefined4 uStack_17d;
  char local_179;
  undefined4 local_178;
  undefined2 *local_170;
  undefined8 local_168;
  undefined2 local_160;
  undefined1 uStack_15e;
  char cStack_15d;
  undefined7 uStack_15c;
  undefined4 uStack_155;
  char local_151;
  undefined4 local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [11];
  undefined4 uStack_12d;
  char local_129;
  undefined4 local_128;
  undefined4 *local_120;
  undefined8 local_118;
  undefined4 local_110 [3];
  undefined4 local_104;
  undefined4 local_100;
  undefined4 *local_f8;
  undefined8 local_f0;
  undefined4 local_e8 [3];
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0 [3];
  undefined4 local_b4;
  undefined4 local_b0;
  undefined4 *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined4 local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined4 *local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 local_64;
  undefined4 *local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 local_44;
  initializer_list<std::pair<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  lVar15 = *(long *)this;
  switch(*(undefined4 *)(lVar15 + 8)) {
  case 0:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  case 1:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    std::operator+(__return_storage_ptr__,"; ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar15 + 0x10));
    goto LAB_0019beeb;
  case 2:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    std::operator+(__return_storage_ptr__,"; ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar15 + 0x10));
    goto LAB_0019beeb;
  case 3:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_2e0._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_2e0._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_320,(ir *)&local_2e0,(shared_ptr<mocker::ir::Addr> *)inst);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_320);
    puVar12 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar12) {
      local_208 = *puVar12;
      lVar19 = plVar7[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)lVar19;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)lVar19 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)lVar19 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)lVar19 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)lVar19 >> 0x30);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*plVar7;
    }
    local_218._8_8_ = plVar7[1];
    *plVar7 = (long)puVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_300,(ir *)(lVar15 + 0x28),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    uVar1 = (long)&((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                   local_300._M_string_length)->_M_ptr + local_218._8_8_;
    uVar16 = 0xf;
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      uVar16 = local_208;
    }
    if (uVar16 < uVar1) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        uVar16 = CONCAT17(local_300.field_2._M_local_buf[7],
                          CONCAT16(local_300.field_2._M_local_buf[6],
                                   CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                            CONCAT13(local_300.field_2._M_local_buf[3],
                                                     CONCAT12(local_300.field_2._M_local_buf[2],
                                                              CONCAT11(local_300.field_2.
                                                                       _M_local_buf[1],
                                                                       local_300.field_2.
                                                                       _M_local_buf[0]))))));
      }
      if (uVar1 <= uVar16) {
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_300,0,(char *)0x0,local_218._M_allocated_capacity);
        goto LAB_0019c305;
      }
    }
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_218._M_local_buf,(ulong)local_300._M_dataplus._M_p);
    goto LAB_0019c305;
  case 4:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_320._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_320._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_((string *)&local_218,(ir *)&local_320,(shared_ptr<mocker::ir::Addr> *)inst);
    plVar7 = (long *)std::__cxx11::string::append(local_218._M_local_buf);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      lVar19 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar19;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    fmtAddr_abi_cxx11_(&local_320,(ir *)(lVar15 + 0x30),addr);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_320,0,(char *)0x0,0x1aeb23);
    puVar12 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar12) {
      local_208 = *puVar12;
      lVar15 = plVar7[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)lVar15;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)lVar15 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)lVar15 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)lVar15 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)lVar15 >> 0x30);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*plVar7;
    }
    local_218._8_8_ = plVar7[1];
    *plVar7 = (long)puVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_218._M_allocated_capacity);
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      lVar15 = CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                        CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                 CONCAT13(local_320.field_2._M_local_buf[3],
                                          CONCAT12(local_320.field_2._M_local_buf[2],
                                                   CONCAT11(local_320.field_2._M_local_buf[1],
                                                            local_320.field_2._M_local_buf[0])))));
      _Var17._M_p = local_320._M_dataplus._M_p;
LAB_0019c661:
      operator_delete(_Var17._M_p,lVar15 + 1);
    }
    break;
  case 5:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    if ((fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_ == '\0')
       && (iVar6 = __cxa_guard_acquire(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                        ::opName_abi_cxx11_),
          inst = (shared_ptr<mocker::ir::IRInst> *)extraout_RDX_15, iVar6 != 0)) {
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320.field_2._M_local_buf[1] = 'i';
      local_320.field_2._M_local_buf[2] = 't';
      local_320.field_2._M_local_buf[3] = 'o';
      local_320.field_2._M_allocated_capacity._4_2_ = 0x72;
      local_218._8_8_ = &sStack_200;
      local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffff00000000;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           0x6962;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           0x74;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ = 'o'
      ;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           0x72;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           local_320.field_2._M_allocated_capacity._6_2_;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _3_4_ = local_320.field_2._11_4_;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = local_320.field_2._M_local_buf[0xf];
      local_208 = 5;
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_300.field_2._M_allocated_capacity._4_2_ = 0x646e;
      local_300.field_2._M_local_buf[1] = 'i';
      local_300.field_2._M_local_buf[2] = 't';
      local_300.field_2._M_local_buf[3] = 'a';
      local_300.field_2._M_local_buf[6] = '\0';
      local_1f0 = 1;
      local_1e8 = &local_1d8;
      local_1d8 = 0x6962;
      uStack_1d6 = 0x74;
      cStack_1d5 = 'a';
      uStack_1d4 = 0x646e;
      cStack_1d2 = '\0';
      uStack_1cd = local_300.field_2._11_4_;
      local_1c9 = local_300.field_2._M_local_buf[0xf];
      local_1e0 = 6;
      local_300._M_string_length = 0;
      local_300.field_2._M_local_buf[0] = '\0';
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      local_2e0.field_2._M_local_buf[1] = 'o';
      local_2e0.field_2._M_local_buf[2] = 'r';
      local_2e0.field_2._M_local_buf[3] = '\0';
      local_1c8 = 2;
      local_1c0 = &local_1b0;
      local_1b0 = 0x6f78;
      uStack_1ae = 0x72;
      cStack_1ad = '\0';
      uStack_1ac = (undefined7)
                   CONCAT44(local_2e0.field_2._8_4_,local_2e0.field_2._M_allocated_capacity._4_4_);
      uStack_1a5._1_3_ = (undefined3)local_2e0.field_2._12_4_;
      uStack_1a5 = CONCAT31(uStack_1a5._1_3_,(char)((uint)local_2e0.field_2._8_4_ >> 0x18));
      local_1a1 = (char)((uint)local_2e0.field_2._12_4_ >> 0x18);
      local_1b8 = 3;
      local_2e0._M_string_length = 0;
      local_2e0.field_2._M_local_buf[0] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_local_buf[1] = 'h';
      local_2b8.field_2._M_local_buf[2] = 'l';
      local_2b8.field_2._M_local_buf[3] = '\0';
      local_1a0 = 3;
      local_198 = &local_188;
      local_188 = 0x6873;
      uStack_186 = 0x6c;
      cStack_185 = '\0';
      uStack_184 = (undefined7)
                   CONCAT44(local_2b8.field_2._8_4_,local_2b8.field_2._M_allocated_capacity._4_4_);
      uStack_17d._1_3_ = (undefined3)local_2b8.field_2._12_4_;
      uStack_17d = CONCAT31(uStack_17d._1_3_,(char)((uint)local_2b8.field_2._8_4_ >> 0x18));
      local_179 = (char)((uint)local_2b8.field_2._12_4_ >> 0x18);
      local_190 = 3;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298.field_2._M_local_buf[1] = 'h';
      local_298.field_2._M_local_buf[2] = 'r';
      local_298.field_2._M_local_buf[3] = '\0';
      local_178 = 4;
      local_170 = &local_160;
      local_160 = 0x6873;
      uStack_15e = 0x72;
      cStack_15d = '\0';
      uStack_15c = (undefined7)
                   CONCAT44(local_298.field_2._8_4_,local_298.field_2._M_allocated_capacity._4_4_);
      uStack_155._1_3_ = (undefined3)local_298.field_2._12_4_;
      uStack_155 = CONCAT31(uStack_155._1_3_,(char)((uint)local_298.field_2._8_4_ >> 0x18));
      local_151 = (char)((uint)local_298.field_2._12_4_ >> 0x18);
      local_168 = 3;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278.field_2._M_local_buf[1] = 'd';
      local_278.field_2._M_local_buf[2] = 'd';
      local_278.field_2._M_local_buf[3] = '\0';
      local_150 = 5;
      local_148 = local_138;
      local_138._0_2_ = 0x6461;
      local_138[2] = 100;
      local_138[3] = '\0';
      local_138._4_7_ =
           (undefined7)
           CONCAT44(local_278.field_2._8_4_,local_278.field_2._M_allocated_capacity._4_4_);
      uStack_12d._1_3_ = (undefined3)local_278.field_2._12_4_;
      uStack_12d = CONCAT31(uStack_12d._1_3_,(char)((uint)local_278.field_2._8_4_ >> 0x18));
      local_129 = (char)((uint)local_278.field_2._12_4_ >> 0x18);
      local_140 = 3;
      local_278._M_string_length = 0;
      local_278.field_2._M_local_buf[0] = '\0';
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_128 = 6;
      local_120 = local_110;
      local_110[0] = 0x627573;
      local_104 = local_258.field_2._12_4_;
      local_118 = 3;
      local_258._M_string_length = 0;
      local_258.field_2._M_allocated_capacity._0_4_ = 0x627500;
      local_238 = &local_228;
      local_100 = 7;
      local_f8 = local_e8;
      local_e8[0] = 0x6c756d;
      local_dc = local_21c;
      local_f0 = 3;
      local_230 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228 = 0x6c7500;
      local_d8 = 8;
      local_d0 = local_c0;
      local_c0[0] = 0x766964;
      local_b4 = local_64;
      local_c8 = 3;
      local_78 = 0;
      local_70 = 0x766900;
      local_b0 = 9;
      local_a8 = (undefined4 *)&local_98;
      local_98._0_4_ = 0x646f6d;
      local_8c = local_44;
      local_a0 = 3;
      local_58 = 0;
      local_50 = 0x646f00;
      local_40._M_array = (iterator)&local_218;
      local_40._M_len = 10;
      local_80 = &local_70;
      local_60 = &local_50;
      SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_,
                 &local_40);
      lVar19 = -400;
      plVar7 = &local_98;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -5;
        lVar19 = lVar19 + 0x28;
      } while (lVar19 != 0);
      if (local_60 != &local_50) {
        operator_delete(local_60,CONCAT44(uStack_4c,local_50) + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,CONCAT44(uStack_6c,local_70) + 1);
      }
      if (local_238 != &local_228) {
        operator_delete(local_238,CONCAT44(uStack_224,local_228) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT44(local_258.field_2._M_allocated_capacity._4_4_,
                                 local_258.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_278.field_2._M_local_buf[3],
                                          CONCAT12(local_278.field_2._M_local_buf[2],
                                                   CONCAT11(local_278.field_2._M_local_buf[1],
                                                            local_278.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_298.field_2._M_local_buf[3],
                                          CONCAT12(local_298.field_2._M_local_buf[2],
                                                   CONCAT11(local_298.field_2._M_local_buf[1],
                                                            local_298.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_2b8.field_2._M_local_buf[3],
                                          CONCAT12(local_2b8.field_2._M_local_buf[2],
                                                   CONCAT11(local_2b8.field_2._M_local_buf[1],
                                                            local_2b8.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_2e0.field_2._M_local_buf[3],
                                          CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                   CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                            local_2e0.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 CONCAT16(local_300.field_2._M_local_buf[6],
                                          CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_300.field_2._M_local_buf[3],
                                                            CONCAT12(local_300.field_2._M_local_buf
                                                                     [2],CONCAT11(local_300.field_2.
                                                                                  _M_local_buf[1],
                                                                                  local_300.field_2.
                                                                                  _M_local_buf[0])))
                                                  ))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                          CONCAT13(local_320.field_2._M_local_buf[3],
                                                   CONCAT12(local_320.field_2._M_local_buf[2],
                                                            CONCAT11(local_320.field_2._M_local_buf
                                                                     [1],local_320.field_2.
                                                                         _M_local_buf[0]))))) + 1);
      }
      __cxa_atexit(SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~SmallMap,
                   &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                           opName_abi_cxx11_);
      inst = (shared_ptr<mocker::ir::IRInst> *)extraout_RDX_16;
    }
    local_238 = *(undefined4 **)(lVar15 + 0x18);
    local_230 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar15 + 0x20);
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_230->_M_use_count = local_230->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_230->_M_use_count = local_230->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_298,(ir *)&local_238,(shared_ptr<mocker::ir::Addr> *)inst);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    plVar10 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      lVar19 = *plVar10;
      local_2b8.field_2._M_local_buf[0] = (char)lVar19;
      local_2b8.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_2b8.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_2b8.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_2b8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar19 >> 0x20);
      local_2b8.field_2._8_4_ = (undefined4)plVar7[3];
      local_2b8.field_2._12_4_ = (undefined4)((ulong)plVar7[3] >> 0x20);
    }
    else {
      lVar19 = *plVar10;
      local_2b8.field_2._M_local_buf[0] = (char)lVar19;
      local_2b8.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_2b8.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_2b8.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_2b8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar19 >> 0x20);
      local_2b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2b8._M_string_length = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_80 = (undefined4 *)CONCAT44(local_80._4_4_,*(undefined4 *)(lVar15 + 0x28));
    pbVar8 = SmallMap<mocker::ir::ArithBinaryInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_,
                  (OpType *)&local_80);
    std::operator+(&local_2e0,&local_2b8,pbVar8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    plVar10 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      lVar19 = *plVar10;
      lVar4 = plVar7[3];
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300.field_2._8_3_ = (undefined3)lVar4;
      local_300.field_2._11_4_ = (undefined4)((ulong)lVar4 >> 0x18);
      local_300.field_2._M_local_buf[0xf] = (char)((ulong)lVar4 >> 0x38);
    }
    else {
      lVar19 = *plVar10;
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_300._M_string_length = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_278,(ir *)(lVar15 + 0x30),
                       (shared_ptr<mocker::ir::Addr> *)local_300._M_string_length);
    std::operator+(&local_320,&local_300,&local_278);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    local_218._M_allocated_capacity = (size_type)&local_208;
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_258,(ir *)(lVar15 + 0x40),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_258);
    goto LAB_0019c0f3;
  case 6:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    if ((fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_ == '\0')
       && (iVar6 = __cxa_guard_acquire(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)
                                        ::opName_abi_cxx11_),
          inst = (shared_ptr<mocker::ir::IRInst> *)extraout_RDX_17, iVar6 != 0)) {
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      local_320.field_2._M_local_buf[1] = 'e';
      local_320.field_2._M_local_buf[2] = '\0';
      local_218._8_8_ = &sStack_200;
      local_218._M_allocated_capacity._0_4_ = 1;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           0x656e;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ = 0;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           local_320.field_2._M_local_buf[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           local_320.field_2._M_allocated_capacity._4_2_;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           local_320.field_2._M_allocated_capacity._6_2_;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _3_4_ = local_320.field_2._11_4_;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = local_320.field_2._M_local_buf[0xf];
      local_208 = 2;
      local_320._M_string_length = 0;
      local_320.field_2._M_local_buf[0] = '\0';
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      local_300.field_2._M_local_buf[1] = 'q';
      local_300.field_2._M_local_buf[2] = '\0';
      local_1f0 = 0;
      local_1e8 = &local_1d8;
      local_1d8 = 0x7165;
      uStack_1d6 = 0;
      cStack_1d5 = local_300.field_2._M_local_buf[3];
      uStack_1d4 = local_300.field_2._M_allocated_capacity._4_2_;
      cStack_1d2 = local_300.field_2._M_local_buf[6];
      uStack_1cd = local_300.field_2._11_4_;
      local_1c9 = local_300.field_2._M_local_buf[0xf];
      local_1e0 = 2;
      local_300._M_string_length = 0;
      local_300.field_2._M_local_buf[0] = '\0';
      local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
      local_2e0.field_2._M_local_buf[1] = 't';
      local_2e0.field_2._M_local_buf[2] = '\0';
      local_1c8 = 2;
      local_1c0 = &local_1b0;
      local_1b0 = 0x746c;
      uStack_1ae = 0;
      cStack_1ad = local_2e0.field_2._M_local_buf[3];
      uStack_1ac = (undefined7)
                   (CONCAT35(local_2e0.field_2._8_3_,
                             CONCAT41(local_2e0.field_2._M_allocated_capacity._4_4_,
                                      local_2e0.field_2._M_local_buf[3])) >> 8);
      uStack_1a5 = CONCAT31(local_2e0.field_2._12_3_,local_2e0.field_2._M_local_buf[0xb]);
      local_1a1 = local_2e0.field_2._M_local_buf[0xf];
      local_1b8 = 2;
      local_2e0._M_string_length = 0;
      local_2e0.field_2._M_local_buf[0] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_local_buf[1] = 'e';
      local_2b8.field_2._M_local_buf[2] = '\0';
      local_1a0 = 4;
      local_198 = &local_188;
      local_188 = 0x656c;
      uStack_186 = 0;
      cStack_185 = local_2b8.field_2._M_local_buf[3];
      uStack_184 = (undefined7)
                   (CONCAT35(local_2b8.field_2._8_3_,
                             CONCAT41(local_2b8.field_2._M_allocated_capacity._4_4_,
                                      local_2b8.field_2._M_local_buf[3])) >> 8);
      uStack_17d = CONCAT31(local_2b8.field_2._12_3_,local_2b8.field_2._M_local_buf[0xb]);
      local_179 = local_2b8.field_2._M_local_buf[0xf];
      local_190 = 2;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_298.field_2._M_local_buf[1] = 't';
      local_298.field_2._M_local_buf[2] = '\0';
      local_178 = 3;
      local_170 = &local_160;
      local_160 = 0x7467;
      uStack_15e = 0;
      cStack_15d = local_298.field_2._M_local_buf[3];
      uStack_15c = (undefined7)
                   (CONCAT35(local_298.field_2._8_3_,
                             CONCAT41(local_298.field_2._M_allocated_capacity._4_4_,
                                      local_298.field_2._M_local_buf[3])) >> 8);
      uStack_155 = CONCAT31(local_298.field_2._12_3_,local_298.field_2._M_local_buf[0xb]);
      local_151 = local_298.field_2._M_local_buf[0xf];
      local_168 = 2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      local_278.field_2._M_local_buf[1] = 'e';
      local_278.field_2._M_local_buf[2] = '\0';
      local_150 = 5;
      local_148 = local_138;
      local_138._0_2_ = 0x6567;
      local_138[2] = 0;
      local_138[3] = local_278.field_2._M_local_buf[3];
      local_138._4_7_ =
           (undefined7)
           (CONCAT35(local_278.field_2._8_3_,
                     CONCAT41(local_278.field_2._M_allocated_capacity._4_4_,
                              local_278.field_2._M_local_buf[3])) >> 8);
      uStack_12d = CONCAT31(local_278.field_2._12_3_,local_278.field_2._M_local_buf[0xb]);
      local_129 = local_278.field_2._M_local_buf[0xf];
      local_140 = 2;
      local_278._M_string_length = 0;
      local_278.field_2._M_local_buf[0] = '\0';
      local_258._M_dataplus._M_p = (pointer)&local_218;
      local_258._M_string_length = 6;
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::SmallMap(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_,
                 (initializer_list<std::pair<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_258);
      lVar19 = -0xf0;
      plVar7 = (long *)local_138;
      do {
        if (plVar7 != (long *)plVar7[-2]) {
          operator_delete((long *)plVar7[-2],*plVar7 + 1);
        }
        plVar7 = plVar7 + -5;
        lVar19 = lVar19 + 0x28;
      } while (lVar19 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_278.field_2._M_local_buf[3],
                                          CONCAT12(local_278.field_2._M_local_buf[2],
                                                   CONCAT11(local_278.field_2._M_local_buf[1],
                                                            local_278.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_298.field_2._M_local_buf[3],
                                          CONCAT12(local_298.field_2._M_local_buf[2],
                                                   CONCAT11(local_298.field_2._M_local_buf[1],
                                                            local_298.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_2b8.field_2._M_local_buf[3],
                                          CONCAT12(local_2b8.field_2._M_local_buf[2],
                                                   CONCAT11(local_2b8.field_2._M_local_buf[1],
                                                            local_2b8.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,
                        CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_2e0.field_2._M_local_buf[3],
                                          CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                   CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                            local_2e0.field_2._M_local_buf[0])))) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,
                        CONCAT17(local_300.field_2._M_local_buf[7],
                                 CONCAT16(local_300.field_2._M_local_buf[6],
                                          CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                   CONCAT13(local_300.field_2._M_local_buf[3],
                                                            CONCAT12(local_300.field_2._M_local_buf
                                                                     [2],CONCAT11(local_300.field_2.
                                                                                  _M_local_buf[1],
                                                                                  local_300.field_2.
                                                                                  _M_local_buf[0])))
                                                  ))) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                          CONCAT13(local_320.field_2._M_local_buf[3],
                                                   CONCAT12(local_320.field_2._M_local_buf[2],
                                                            CONCAT11(local_320.field_2._M_local_buf
                                                                     [1],local_320.field_2.
                                                                         _M_local_buf[0]))))) + 1);
      }
      __cxa_atexit(SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~SmallMap,
                   &fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::
                           opName_abi_cxx11_);
      inst = (shared_ptr<mocker::ir::IRInst> *)extraout_RDX_18;
    }
    local_238 = *(undefined4 **)(lVar15 + 0x18);
    local_230 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar15 + 0x20);
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_230->_M_use_count = local_230->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_230->_M_use_count = local_230->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_298,(ir *)&local_238,(shared_ptr<mocker::ir::Addr> *)inst);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    plVar10 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      lVar19 = *plVar10;
      local_2b8.field_2._M_local_buf[0] = (char)lVar19;
      local_2b8.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_2b8.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_2b8.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_2b8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar19 >> 0x20);
      local_2b8.field_2._8_4_ = (undefined4)plVar7[3];
      local_2b8.field_2._12_4_ = (undefined4)((ulong)plVar7[3] >> 0x20);
    }
    else {
      lVar19 = *plVar10;
      local_2b8.field_2._M_local_buf[0] = (char)lVar19;
      local_2b8.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_2b8.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_2b8.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_2b8.field_2._M_allocated_capacity._4_4_ = (undefined4)((ulong)lVar19 >> 0x20);
      local_2b8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_2b8._M_string_length = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_80 = (undefined4 *)CONCAT44(local_80._4_4_,*(undefined4 *)(lVar15 + 0x28));
    pbVar8 = SmallMap<mocker::ir::RelationInst::OpType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::at(&fmtInst[abi:cxx11](std::shared_ptr<mocker::ir::IRInst>const&)::opName_abi_cxx11_,
                  (OpType *)&local_80);
    std::operator+(&local_2e0,&local_2b8,pbVar8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    plVar10 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      lVar19 = *plVar10;
      lVar4 = plVar7[3];
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300.field_2._8_3_ = (undefined3)lVar4;
      local_300.field_2._11_4_ = (undefined4)((ulong)lVar4 >> 0x18);
      local_300.field_2._M_local_buf[0xf] = (char)((ulong)lVar4 >> 0x38);
    }
    else {
      lVar19 = *plVar10;
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_300._M_string_length = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_278,(ir *)(lVar15 + 0x30),
                       (shared_ptr<mocker::ir::Addr> *)local_300._M_string_length);
    std::operator+(&local_320,&local_300,&local_278);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    local_218._M_allocated_capacity = (size_type)&local_208;
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_258,(ir *)(lVar15 + 0x40),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_258);
LAB_0019c0f3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,
                      CONCAT44(local_258.field_2._M_allocated_capacity._4_4_,
                               local_258.field_2._M_allocated_capacity._0_4_) + 1);
    }
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                        CONCAT13(local_320.field_2._M_local_buf[3],
                                                 CONCAT12(local_320.field_2._M_local_buf[2],
                                                          CONCAT11(local_320.field_2._M_local_buf[1]
                                                                   ,local_320.field_2._M_local_buf
                                                                    [0]))))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_278.field_2._M_local_buf[3],
                                        CONCAT12(local_278.field_2._M_local_buf[2],
                                                 CONCAT11(local_278.field_2._M_local_buf[1],
                                                          local_278.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT16(local_300.field_2._M_local_buf[6],
                                        CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_300.field_2._M_local_buf[3],
                                                          CONCAT12(local_300.field_2._M_local_buf[2]
                                                                   ,CONCAT11(local_300.field_2.
                                                                             _M_local_buf[1],
                                                                             local_300.field_2.
                                                                             _M_local_buf[0])))))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_2e0.field_2._M_local_buf[3],
                                        CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                 CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                          local_2e0.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,
                      CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_2b8.field_2._M_local_buf[3],
                                        CONCAT12(local_2b8.field_2._M_local_buf[2],
                                                 CONCAT11(local_2b8.field_2._M_local_buf[1],
                                                          local_2b8.field_2._M_local_buf[0])))) + 1)
      ;
    }
    this_00 = local_230;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_298.field_2._M_local_buf[3],
                                        CONCAT12(local_298.field_2._M_local_buf[2],
                                                 CONCAT11(local_298.field_2._M_local_buf[1],
                                                          local_298.field_2._M_local_buf[0])))) + 1)
      ;
      this_00 = local_230;
    }
    goto LAB_0019c470;
  case 7:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_300,(ir *)(lVar15 + 0x10),(shared_ptr<mocker::ir::Addr> *)inst);
    std::operator+(&local_320,"store ",&local_300);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_2e0,(ir *)(lVar15 + 0x20),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_2e0.field_2._M_local_buf[3],
                                        CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                 CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                          local_2e0.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                        CONCAT13(local_320.field_2._M_local_buf[3],
                                                 CONCAT12(local_320.field_2._M_local_buf[2],
                                                          CONCAT11(local_320.field_2._M_local_buf[1]
                                                                   ,local_320.field_2._M_local_buf
                                                                    [0]))))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      lVar15 = CONCAT17(local_300.field_2._M_local_buf[7],
                        CONCAT16(local_300.field_2._M_local_buf[6],
                                 CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                          CONCAT13(local_300.field_2._M_local_buf[3],
                                                   CONCAT12(local_300.field_2._M_local_buf[2],
                                                            CONCAT11(local_300.field_2._M_local_buf
                                                                     [1],local_300.field_2.
                                                                         _M_local_buf[0]))))));
      _Var17._M_p = local_300._M_dataplus._M_p;
      goto LAB_0019c661;
    }
    break;
  case 8:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_2e0._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_2e0._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_320,(ir *)&local_2e0,(shared_ptr<mocker::ir::Addr> *)inst);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    local_218._M_allocated_capacity = (size_type)&local_208;
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_300,(ir *)(lVar15 + 0x28),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_300);
    goto LAB_0019c418;
  case 9:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_320._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_320._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_((string *)&local_218,(ir *)&local_320,(shared_ptr<mocker::ir::Addr> *)inst);
    plVar7 = (long *)std::__cxx11::string::append(local_218._M_local_buf);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      lVar15 = plVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar15;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    goto LAB_0019b6b3;
  case 10:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_2e0._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_2e0._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_320,(ir *)&local_2e0,(shared_ptr<mocker::ir::Addr> *)inst);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    fmtAddr_abi_cxx11_(&local_300,(ir *)(lVar15 + 0x28),
                       (shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    uVar1 = (long)&((__shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2> *)
                   local_300._M_string_length)->_M_ptr + local_218._8_8_;
    uVar16 = 0xf;
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      uVar16 = local_208;
    }
    if (uVar16 < uVar1) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        uVar16 = CONCAT17(local_300.field_2._M_local_buf[7],
                          CONCAT16(local_300.field_2._M_local_buf[6],
                                   CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                            CONCAT13(local_300.field_2._M_local_buf[3],
                                                     CONCAT12(local_300.field_2._M_local_buf[2],
                                                              CONCAT11(local_300.field_2.
                                                                       _M_local_buf[1],
                                                                       local_300.field_2.
                                                                       _M_local_buf[0]))))));
      }
      if (uVar1 <= uVar16) {
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_300,0,(char *)0x0,local_218._M_allocated_capacity);
        goto LAB_0019c305;
      }
    }
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_218._M_local_buf,(ulong)local_300._M_dataplus._M_p);
LAB_0019c305:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar11 = puVar9 + 2;
    if ((size_type *)*puVar9 == psVar11) {
      uVar5 = puVar9[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar9;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar11;
    }
    __return_storage_ptr__->_M_string_length = puVar9[1];
    *puVar9 = psVar11;
    puVar9[1] = 0;
    *(undefined1 *)psVar11 = 0;
LAB_0019c418:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT16(local_300.field_2._M_local_buf[6],
                                        CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_300.field_2._M_local_buf[3],
                                                          CONCAT12(local_300.field_2._M_local_buf[2]
                                                                   ,CONCAT11(local_300.field_2.
                                                                             _M_local_buf[1],
                                                                             local_300.field_2.
                                                                             _M_local_buf[0])))))) +
                      1);
    }
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                        CONCAT13(local_320.field_2._M_local_buf[3],
                                                 CONCAT12(local_320.field_2._M_local_buf[2],
                                                          CONCAT11(local_320.field_2._M_local_buf[1]
                                                                   ,local_320.field_2._M_local_buf
                                                                    [0]))))) + 1);
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0._M_string_length;
    }
LAB_0019c470:
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    break;
  case 0xb:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_2b8,(ir *)(lVar15 + 0x18),(shared_ptr<mocker::ir::Addr> *)inst);
    std::operator+(&local_2e0,"br ",&local_2b8);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar10 = plVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar10) {
      lVar19 = *plVar10;
      lVar4 = plVar7[3];
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300.field_2._8_3_ = (undefined3)lVar4;
      local_300.field_2._11_4_ = (undefined4)((ulong)lVar4 >> 0x18);
      local_300.field_2._M_local_buf[0xf] = (char)((ulong)lVar4 >> 0x38);
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    }
    else {
      lVar19 = *plVar10;
      local_300.field_2._M_local_buf[0] = (char)lVar19;
      local_300.field_2._M_local_buf[1] = (char)((ulong)lVar19 >> 8);
      local_300.field_2._M_local_buf[2] = (char)((ulong)lVar19 >> 0x10);
      local_300.field_2._M_local_buf[3] = (char)((ulong)lVar19 >> 0x18);
      local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar19 >> 0x20);
      local_300.field_2._M_local_buf[6] = (char)((ulong)lVar19 >> 0x30);
      local_300.field_2._M_local_buf[7] = (char)((ulong)lVar19 >> 0x38);
      local_300._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_300._M_string_length = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_258._M_dataplus._M_p = *(pointer *)(lVar15 + 0x28);
    local_258._M_string_length = *(long *)(lVar15 + 0x30);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_298,(ir *)&local_258,
                       (shared_ptr<mocker::ir::Addr> *)local_300._M_string_length);
    std::operator+(&local_320,&local_300,&local_298);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
    puVar12 = puVar9 + 2;
    if ((ulong *)*puVar9 == puVar12) {
      local_208 = *puVar12;
      uVar5 = puVar9[3];
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
           (undefined2)uVar5;
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
           (undefined1)((ulong)uVar5 >> 0x10);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
           (char)((ulong)uVar5 >> 0x18);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
           (undefined2)((ulong)uVar5 >> 0x20);
      sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
           (undefined2)((ulong)uVar5 >> 0x30);
      local_218._M_allocated_capacity = (size_type)&local_208;
    }
    else {
      local_208 = *puVar12;
      local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
    }
    local_218._8_8_ = puVar9[1];
    *puVar9 = puVar12;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_238 = *(undefined4 **)(lVar15 + 0x38);
    local_230 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar15 + 0x40);
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_230->_M_use_count = local_230->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_230->_M_use_count = local_230->_M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_(&local_278,(ir *)&local_238,(shared_ptr<mocker::ir::Addr> *)local_218._8_8_);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   &local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT44(local_278.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_278.field_2._M_local_buf[3],
                                        CONCAT12(local_278.field_2._M_local_buf[2],
                                                 CONCAT11(local_278.field_2._M_local_buf[1],
                                                          local_278.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
    }
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,
                      CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                               CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                        CONCAT13(local_320.field_2._M_local_buf[3],
                                                 CONCAT12(local_320.field_2._M_local_buf[2],
                                                          CONCAT11(local_320.field_2._M_local_buf[1]
                                                                   ,local_320.field_2._M_local_buf
                                                                    [0]))))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_298.field_2._M_local_buf[3],
                                        CONCAT12(local_298.field_2._M_local_buf[2],
                                                 CONCAT11(local_298.field_2._M_local_buf[1],
                                                          local_298.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,
                      CONCAT17(local_300.field_2._M_local_buf[7],
                               CONCAT16(local_300.field_2._M_local_buf[6],
                                        CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                 CONCAT13(local_300.field_2._M_local_buf[3],
                                                          CONCAT12(local_300.field_2._M_local_buf[2]
                                                                   ,CONCAT11(local_300.field_2.
                                                                             _M_local_buf[1],
                                                                             local_300.field_2.
                                                                             _M_local_buf[0])))))) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_2e0.field_2._M_local_buf[3],
                                        CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                 CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                          local_2e0.field_2._M_local_buf[0])))) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      lVar15 = CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                        CONCAT13(local_2b8.field_2._M_local_buf[3],
                                 CONCAT12(local_2b8.field_2._M_local_buf[2],
                                          CONCAT11(local_2b8.field_2._M_local_buf[1],
                                                   local_2b8.field_2._M_local_buf[0]))));
      _Var17._M_p = local_2b8._M_dataplus._M_p;
      goto LAB_0019c661;
    }
    break;
  case 0xc:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    local_320._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_320._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_((string *)&local_218,(ir *)&local_320,(shared_ptr<mocker::ir::Addr> *)inst);
    std::operator+(__return_storage_ptr__,"jump ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218);
LAB_0019b6b3:
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length);
    }
    goto LAB_0019beeb;
  case 0xd:
    p_Var14 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
      }
    }
    if (*(long *)(lVar15 + 0x18) == 0) {
      local_218._M_allocated_capacity = (size_type)&local_208;
      local_218._8_8_ = (shared_ptr<mocker::ir::Addr> *)0x4;
      local_208 = CONCAT35(local_208._5_3_,0x64696f76);
    }
    else {
      fmtAddr_abi_cxx11_((string *)&local_218,(ir *)(lVar15 + 0x18),
                         (shared_ptr<mocker::ir::Addr> *)inst);
    }
    std::operator+(__return_storage_ptr__,"ret ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218);
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
    }
LAB_0019beeb:
    if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return __return_storage_ptr__;
    }
    goto LAB_0019c671;
  case 0xe:
    local_2c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
      }
    }
    local_88 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    paVar2 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)(lVar15 + 0x18);
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      local_300._M_string_length = *(long *)(lVar15 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length)->
                 _M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length)->_M_use_count
               = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length)->
                 _M_use_count + 1;
        }
      }
      local_300._M_dataplus._M_p = (pointer)paVar2;
      fmtAddr_abi_cxx11_(&local_320,(ir *)&local_300,(shared_ptr<mocker::ir::Addr> *)inst);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_320);
      puVar12 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar12) {
        local_208 = *puVar12;
        uVar5 = puVar9[3];
        sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
             (undefined2)uVar5;
        sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
             (undefined1)((ulong)uVar5 >> 0x10);
        sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
             (char)((ulong)uVar5 >> 0x18);
        sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
             (undefined2)((ulong)uVar5 >> 0x20);
        sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
             (undefined2)((ulong)uVar5 >> 0x30);
        local_218._M_allocated_capacity = (size_type)&local_208;
      }
      else {
        local_208 = *puVar12;
        local_218._M_allocated_capacity = (size_type)(ulong *)*puVar9;
      }
      local_218._8_8_ = puVar9[1];
      *puVar9 = puVar12;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)local_218._M_local_buf);
      if ((ulong *)local_218._M_allocated_capacity != &local_208) {
        operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,
                        CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                                 CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                          CONCAT13(local_320.field_2._M_local_buf[3],
                                                   CONCAT12(local_320.field_2._M_local_buf[2],
                                                            CONCAT11(local_320.field_2._M_local_buf
                                                                     [1],local_320.field_2.
                                                                         _M_local_buf[0]))))) + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_300._M_string_length);
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   "call ",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (lVar15 + 0x28));
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_218._M_allocated_capacity);
    psVar13 = extraout_RDX_10;
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
      psVar13 = extraout_RDX_11;
    }
    piVar18 = *(ir **)(lVar15 + 0x48);
    piVar3 = *(ir **)(lVar15 + 0x50);
    p_Var14 = local_2c0;
    if (piVar18 != piVar3) {
      do {
        fmtAddr_abi_cxx11_(&local_320,piVar18,psVar13);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_218," ",&local_320);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,local_218._M_allocated_capacity);
        psVar13 = extraout_RDX_12;
        if ((ulong *)local_218._M_allocated_capacity != &local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
          psVar13 = extraout_RDX_13;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,
                          CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                            CONCAT13(local_320.field_2._M_local_buf[3],
                                                     CONCAT12(local_320.field_2._M_local_buf[2],
                                                              CONCAT11(local_320.field_2.
                                                                       _M_local_buf[1],
                                                                       local_320.field_2.
                                                                       _M_local_buf[0]))))) + 1);
          psVar13 = extraout_RDX_14;
        }
        piVar18 = piVar18 + 0x10;
        p_Var14 = local_2c0;
      } while (piVar18 != piVar3);
    }
    break;
  case 0xf:
    local_2c0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
    if (local_2c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_2c0->_M_use_count = local_2c0->_M_use_count + 1;
      }
    }
    local_320._M_dataplus._M_p = *(pointer *)(lVar15 + 0x18);
    local_320._M_string_length = *(long *)(lVar15 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length)->
             _M_use_count + 1;
      }
    }
    fmtAddr_abi_cxx11_((string *)&local_218,(ir *)&local_320,(shared_ptr<mocker::ir::Addr> *)inst);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218,
                   " = phi ");
    psVar13 = extraout_RDX;
    if ((ulong *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
      psVar13 = extraout_RDX_00;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_320._M_string_length);
      psVar13 = extraout_RDX_01;
    }
    piVar18 = *(ir **)(lVar15 + 0x28);
    piVar3 = *(ir **)(lVar15 + 0x30);
    p_Var14 = local_2c0;
    if (piVar18 != piVar3) {
      do {
        fmtAddr_abi_cxx11_(&local_2b8,piVar18,psVar13);
        std::operator+(&local_2e0,"[ ",&local_2b8);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2e0);
        local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
        plVar10 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar10) {
          lVar15 = *plVar10;
          lVar19 = plVar7[3];
          local_300.field_2._M_local_buf[0] = (char)lVar15;
          local_300.field_2._M_local_buf[1] = (char)((ulong)lVar15 >> 8);
          local_300.field_2._M_local_buf[2] = (char)((ulong)lVar15 >> 0x10);
          local_300.field_2._M_local_buf[3] = (char)((ulong)lVar15 >> 0x18);
          local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar15 >> 0x20);
          local_300.field_2._M_local_buf[6] = (char)((ulong)lVar15 >> 0x30);
          local_300.field_2._M_local_buf[7] = (char)((ulong)lVar15 >> 0x38);
          local_300.field_2._8_3_ = (undefined3)lVar19;
          local_300.field_2._11_4_ = (undefined4)((ulong)lVar19 >> 0x18);
          local_300.field_2._M_local_buf[0xf] = (char)((ulong)lVar19 >> 0x38);
        }
        else {
          lVar15 = *plVar10;
          local_300.field_2._M_local_buf[0] = (char)lVar15;
          local_300.field_2._M_local_buf[1] = (char)((ulong)lVar15 >> 8);
          local_300.field_2._M_local_buf[2] = (char)((ulong)lVar15 >> 0x10);
          local_300.field_2._M_local_buf[3] = (char)((ulong)lVar15 >> 0x18);
          local_300.field_2._M_allocated_capacity._4_2_ = (undefined2)((ulong)lVar15 >> 0x20);
          local_300.field_2._M_local_buf[6] = (char)((ulong)lVar15 >> 0x30);
          local_300.field_2._M_local_buf[7] = (char)((ulong)lVar15 >> 0x38);
          local_300._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_300._M_string_length = plVar7[1];
        *plVar7 = (long)plVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_278._M_dataplus._M_p = *(pointer *)(piVar18 + 0x10);
        local_278._M_string_length = *(size_type *)(piVar18 + 0x18);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_278._M_string_length)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length)->
            _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_278._M_string_length)->_M_use_count + 1;
          }
        }
        fmtAddr_abi_cxx11_(&local_298,(ir *)&local_278,
                           (shared_ptr<mocker::ir::Addr> *)local_300._M_string_length);
        std::operator+(&local_320,&local_300,&local_298);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_320);
        puVar12 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar12) {
          local_208 = *puVar12;
          lVar15 = plVar7[3];
          sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_ =
               (undefined2)lVar15;
          sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._2_1_ =
               (undefined1)((ulong)lVar15 >> 0x10);
          sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._3_1_ =
               (char)((ulong)lVar15 >> 0x18);
          sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_2_ =
               (undefined2)((ulong)lVar15 >> 0x20);
          sStack_200.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr._6_2_ =
               (undefined2)((ulong)lVar15 >> 0x30);
          local_218._M_allocated_capacity = (size_type)&local_208;
        }
        else {
          local_208 = *puVar12;
          local_218._M_allocated_capacity = (size_type)(ulong *)*plVar7;
        }
        local_218._8_8_ = plVar7[1];
        *plVar7 = (long)puVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,local_218._M_allocated_capacity);
        psVar13 = extraout_RDX_02;
        if ((ulong *)local_218._M_allocated_capacity != &local_208) {
          operator_delete((void *)local_218._M_allocated_capacity,local_208 + 1);
          psVar13 = extraout_RDX_03;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,
                          CONCAT26(local_320.field_2._M_allocated_capacity._6_2_,
                                   CONCAT24(local_320.field_2._M_allocated_capacity._4_2_,
                                            CONCAT13(local_320.field_2._M_local_buf[3],
                                                     CONCAT12(local_320.field_2._M_local_buf[2],
                                                              CONCAT11(local_320.field_2.
                                                                       _M_local_buf[1],
                                                                       local_320.field_2.
                                                                       _M_local_buf[0]))))) + 1);
          psVar13 = extraout_RDX_04;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,
                          CONCAT44(local_298.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_298.field_2._M_local_buf[3],
                                            CONCAT12(local_298.field_2._M_local_buf[2],
                                                     CONCAT11(local_298.field_2._M_local_buf[1],
                                                              local_298.field_2._M_local_buf[0]))))
                          + 1);
          psVar13 = extraout_RDX_05;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
          psVar13 = extraout_RDX_06;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_300._M_dataplus._M_p != &local_300.field_2) {
          operator_delete(local_300._M_dataplus._M_p,
                          CONCAT17(local_300.field_2._M_local_buf[7],
                                   CONCAT16(local_300.field_2._M_local_buf[6],
                                            CONCAT24(local_300.field_2._M_allocated_capacity._4_2_,
                                                     CONCAT13(local_300.field_2._M_local_buf[3],
                                                              CONCAT12(local_300.field_2.
                                                                       _M_local_buf[2],
                                                                       CONCAT11(local_300.field_2.
                                                                                _M_local_buf[1],
                                                                                local_300.field_2.
                                                                                _M_local_buf[0])))))
                                  ) + 1);
          psVar13 = extraout_RDX_07;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,
                          CONCAT44(local_2e0.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_2e0.field_2._M_local_buf[3],
                                            CONCAT12(local_2e0.field_2._M_local_buf[2],
                                                     CONCAT11(local_2e0.field_2._M_local_buf[1],
                                                              local_2e0.field_2._M_local_buf[0]))))
                          + 1);
          psVar13 = extraout_RDX_08;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,
                          CONCAT44(local_2b8.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_2b8.field_2._M_local_buf[3],
                                            CONCAT12(local_2b8.field_2._M_local_buf[2],
                                                     CONCAT11(local_2b8.field_2._M_local_buf[1],
                                                              local_2b8.field_2._M_local_buf[0]))))
                          + 1);
          psVar13 = extraout_RDX_09;
        }
        piVar18 = piVar18 + 0x20;
        p_Var14 = local_2c0;
      } while (piVar18 != piVar3);
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir/src/printer.cpp"
                  ,0x6a,"std::string mocker::ir::fmtInst(const std::shared_ptr<IRInst> &)");
  }
  if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0019c671:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var14);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fmtInst(const std::shared_ptr<IRInst> &inst) {
  using namespace std::string_literals;

  if (dyc<Deleted>(inst)) {
    return "";
  }
  if (auto p = dyc<Assign>(inst)) {
    return fmtAddr(p->getDest()) + " = assign " + fmtAddr(p->getOperand());
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto res = fmtAddr(p->getDest()) + " = ";
    res += (p->getOp() == ArithUnaryInst::Neg ? "neg" : "bitnot");
    res += " " + fmtAddr(p->getOperand());
    return res;
  }
  if (auto p = dyc<Alloca>(inst)) {
    return fmtAddr(p->getDest()) + " = alloca";
  }
  if (auto p = dyc<Malloc>(inst)) {
    return fmtAddr(p->getDest()) + " = malloc " + fmtAddr(p->getSize());
  }
  if (auto p = dyc<Store>(inst)) {
    return "store " + fmtAddr(p->getAddr()) + " " + fmtAddr(p->getVal());
  }
  if (auto p = dyc<Load>(inst)) {
    return fmtAddr(p->getDest()) + " = load " + fmtAddr(p->getAddr());
  }
  if (auto p = dyc<Branch>(inst)) {
    return "br " + fmtAddr(p->getCondition()) + " " + fmtAddr(p->getThen()) +
           " " + fmtAddr(p->getElse());
  }
  if (auto p = dyc<Jump>(inst)) {
    return "jump " + fmtAddr(p->getLabel());
  }
  if (auto p = dyc<Ret>(inst)) {
    return "ret " + (p->getVal() ? fmtAddr(p->getVal()) : "void"s);
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    static SmallMap<ArithBinaryInst::OpType, std::string> opName{
        {ArithBinaryInst::BitOr, "bitor"s},
        {ArithBinaryInst::BitAnd, "bitand"s},
        {ArithBinaryInst::Xor, "xor"s},
        {ArithBinaryInst::Shl, "shl"s},
        {ArithBinaryInst::Shr, "shr"s},
        {ArithBinaryInst::Add, "add"s},
        {ArithBinaryInst::Sub, "sub"s},
        {ArithBinaryInst::Mul, "mul"s},
        {ArithBinaryInst::Div, "div"s},
        {ArithBinaryInst::Mod, "mod"s},
    };
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  if (auto p = dyc<Comment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<AttachedComment>(inst)) {
    return "; " + p->getContent();
  }
  if (auto p = dyc<Call>(inst)) {
    std::string res;
    if (p->getDest())
      res = fmtAddr(p->getDest()) + " = ";
    res += "call " + p->getFuncName();
    for (auto &addr : p->getArgs())
      res += " " + fmtAddr(addr);
    return res;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::string res = fmtAddr(p->getDest()) + " = phi ";
    for (auto &kv : p->getOptions())
      res += "[ " + fmtAddr(kv.first) + " " + fmtAddr(kv.second) + " ] ";
    return res;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    static SmallMap<RelationInst::OpType, std::string> opName{
        {RelationInst::OpType::Ne, "ne"s}, {RelationInst::OpType::Eq, "eq"s},
        {RelationInst::OpType::Lt, "lt"s}, {RelationInst::OpType::Le, "le"s},
        {RelationInst::OpType::Gt, "gt"s}, {RelationInst::OpType::Ge, "ge"s}};
    return fmtAddr(p->getDest()) + " = " + opName.at(p->getOp()) + " " +
           fmtAddr(p->getLhs()) + " " + fmtAddr(p->getRhs());
  }
  assert(false);
}